

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall Address_P2pkhAddressTest_Test::TestBody(Address_P2pkhAddressTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_928;
  Message local_920;
  NetType local_918 [2];
  undefined1 local_910 [8];
  AssertionResult gtest_ar_10;
  Message local_8f8;
  string local_8f0;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_9;
  Message local_8b8;
  Address local_8b0;
  AssertHelper local_738;
  Message local_730;
  NetType local_728 [2];
  undefined1 local_720 [8];
  AssertionResult gtest_ar_8;
  Message local_708;
  string local_700;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_7;
  Message local_6c8;
  Address local_6c0;
  AssertHelper local_548;
  Message local_540;
  Script local_538;
  string local_500;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_6;
  Message local_4c8;
  Pubkey local_4c0;
  string local_4a8;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_5;
  Message local_470;
  ByteData local_468;
  string local_450;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_4;
  Message local_418;
  WitnessVersion local_410 [2];
  undefined1 local_408 [8];
  AssertionResult gtest_ar_3;
  Message local_3f0;
  AddressType local_3e8 [2];
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_2;
  Message local_3c8;
  NetType local_3c0 [2];
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_1;
  Message local_3a0;
  string local_398;
  undefined1 local_378 [8];
  AssertionResult gtest_ar;
  Message local_360 [2];
  Address local_350;
  undefined1 local_1d8 [8];
  Address address;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  Pubkey pubkey;
  Address_P2pkhAddressTest_Test *this_local;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_49);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::Address::Address((Address *)local_1d8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::Address(&local_350,kCfdSuccess,(Pubkey *)local_28);
      cfd::core::Address::operator=((Address *)local_1d8,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message(local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x34,
               "Expected: (address = Address(NetType::kMainnet, pubkey)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_360);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_398,(Address *)local_1d8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_378,"\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\"",
             "address.GetAddress().c_str()","1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn",pcVar2);
  std::__cxx11::string::~string((string *)&local_398);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_3c0[1] = 0;
  local_3c0[0] = cfd::core::Address::GetNetType((Address *)local_1d8);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_3b8,"NetType::kMainnet","address.GetNetType()",local_3c0 + 1,
             local_3c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  local_3e8[1] = 2;
  local_3e8[0] = cfd::core::Address::GetAddressType((Address *)local_1d8);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_3e0,"AddressType::kP2pkhAddress","address.GetAddressType()",
             local_3e8 + 1,local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  local_410[1] = 0xffffffff;
  local_410[0] = cfd::core::Address::GetWitnessVersion((Address *)local_1d8);
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((EqHelper<false> *)local_408,"WitnessVersion::kVersionNone",
             "address.GetWitnessVersion()",local_410 + 1,local_410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  cfd::core::Address::GetHash(&local_468,(Address *)local_1d8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_450,&local_468);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_430,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_450);
  cfd::core::ByteData::~ByteData(&local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  cfd::core::Address::GetPubkey(&local_4c0,(Address *)local_1d8);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_4a8,&local_4c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_488,
             "\"027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af\"",
             "address.GetPubkey().GetHex().c_str()",
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",pcVar2);
  std::__cxx11::string::~string((string *)&local_4a8);
  cfd::core::Pubkey::~Pubkey(&local_4c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  cfd::core::Address::GetScript(&local_538,(Address *)local_1d8);
  cfd::core::Script::GetHex_abi_cxx11_(&local_500,&local_538);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4e0,"\"\"","address.GetScript().GetHex().c_str()","",pcVar2);
  std::__cxx11::string::~string((string *)&local_500);
  cfd::core::Script::~Script(&local_538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_548,&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_548);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::Address(&local_6c0,kCfdIllegalArgumentError,(Pubkey *)local_28);
      cfd::core::Address::operator=((Address *)local_1d8,&local_6c0);
      cfd::core::Address::~Address(&local_6c0);
    }
  }
  else {
    testing::Message::Message(&local_6c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x3f,
               "Expected: (address = Address(NetType::kTestnet, pubkey)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_6c8);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_700,(Address *)local_1d8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6e0,"\"mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc\"",
             "address.GetAddress().c_str()","mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc",pcVar2);
  std::__cxx11::string::~string((string *)&local_700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  local_728[1] = 1;
  local_728[0] = cfd::core::Address::GetNetType((Address *)local_1d8);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_720,"NetType::kTestnet","address.GetNetType()",local_728 + 1,
             local_728);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_738,&local_730);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::Address(&local_8b0,kCfdIllegalStateError,(Pubkey *)local_28);
      cfd::core::Address::operator=((Address *)local_1d8,&local_8b0);
      cfd::core::Address::~Address(&local_8b0);
    }
  }
  else {
    testing::Message::Message(&local_8b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x44,
               "Expected: (address = Address(NetType::kRegtest, pubkey)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_8b8);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_8f0,(Address *)local_1d8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8d0,"\"mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc\"",
             "address.GetAddress().c_str()","mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc",pcVar2);
  std::__cxx11::string::~string((string *)&local_8f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  local_918[1] = 2;
  local_918[0] = cfd::core::Address::GetNetType((Address *)local_1d8);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_910,"NetType::kRegtest","address.GetNetType()",local_918 + 1,
             local_918);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar1) {
    testing::Message::Message(&local_920);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
    testing::internal::AssertHelper::AssertHelper
              (&local_928,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_928,&local_920);
    testing::internal::AssertHelper::~AssertHelper(&local_928);
    testing::Message::~Message(&local_920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  cfd::core::Address::~Address((Address *)local_1d8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(Address, P2pkhAddressTest) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address address;
  EXPECT_NO_THROW((address = Address(NetType::kMainnet, pubkey)));
  EXPECT_STREQ("1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn", address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersionNone, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
               address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address(NetType::kTestnet, pubkey)));
  EXPECT_STREQ("mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());

  EXPECT_NO_THROW((address = Address(NetType::kRegtest, pubkey)));
  EXPECT_STREQ("mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
}